

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwatson.c
# Opt level: O1

int watson_write_from_buffer_to_buffer
              (IOFormat input,IOFormat output,char *source,size_t source_size,char *dest,
              size_t dest_size)

{
  int iVar1;
  Data data;
  
  iVar1 = -1;
  if (dest != (char *)0x0 && source != (char *)0x0) {
    data = (*decodeMap[input].parseString)(source,source_size);
    if (data == (Data)0x0) {
      iVar1 = -2;
    }
    else {
      iVar1 = (*decodeMap[output].writeToBuffer)(data,dest,dest_size);
      deepFreeData(data);
    }
  }
  return iVar1;
}

Assistant:

int watson_write_from_buffer_to_buffer(IOFormat input, IOFormat output, char *source, size_t source_size, char *dest,
                                       size_t dest_size) {
    if (source == NULL || dest == NULL)return LIB_WATSON_INVALID_PARAMS;
    Data d = decodeMap[input].parseString(source, source_size);
    if (d == NULL)return LIB_WATSON_PARSE_ERROR;
    int k = decodeMap[output].writeToBuffer(d, dest, dest_size);
    deepFreeData(d);
    return k;
}